

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O2

result_pair_type __thiscall
MeCab::Darts::DoubleArrayImpl<char,unsigned_char,int,unsigned_int,MeCab::Darts::Length<char>>::
exactMatchSearch<MeCab::Darts::DoubleArrayImpl<char,unsigned_char,int,unsigned_int,MeCab::Darts::Length<char>>::result_pair_type>
          (DoubleArrayImpl<char,unsigned_char,int,unsigned_int,MeCab::Darts::Length<char>> *this,
          key_type *key,size_t len,size_t node_pos)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  size_t sVar5;
  size_t sVar6;
  uint *puVar7;
  result_pair_type rVar8;
  
  if (len == 0) {
    len = strlen(key);
  }
  lVar3 = *(long *)this;
  puVar7 = (uint *)(lVar3 + node_pos * 8);
  sVar5 = 0;
  uVar4 = 0xffffffffffffffff;
  sVar6 = 0;
  do {
    uVar1 = *puVar7;
    if (len == sVar6) {
      uVar2 = *(uint *)(lVar3 + (ulong)uVar1 * 8);
      uVar4 = 0xffffffff;
      sVar5 = 0;
      if (uVar1 == *(uint *)(lVar3 + 4 + (ulong)uVar1 * 8) && (int)uVar2 < 0) {
        uVar4 = (ulong)~uVar2;
        sVar5 = len;
      }
      break;
    }
    puVar7 = (uint *)(lVar3 + (ulong)((byte)key[sVar6] + uVar1 + 1) * 8);
    sVar6 = sVar6 + 1;
  } while (uVar1 == puVar7[1]);
  rVar8.length = sVar5;
  rVar8._0_8_ = uVar4;
  return rVar8;
}

Assistant:

inline T exactMatchSearch(const key_type *key,
                            size_t len = 0,
                            size_t node_pos = 0) const {
    if (!len) len = length_func_()(key);

    T result;
    set_result(result, -1, 0);

    register array_type_  b = array_[node_pos].base;
    register array_u_type_ p;

    for (register size_t i = 0; i < len; ++i) {
      p = b +(node_u_type_)(key[i]) + 1;
      if (static_cast<array_u_type_>(b) == array_[p].check)
        b = array_[p].base;
      else
        return result;
    }

    p = b;
    array_type_ n = array_[p].base;
    if (static_cast<array_u_type_>(b) == array_[p].check && n < 0)
      set_result(result, -n-1, len);

    return result;
  }